

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ushort smf::MidiFile::readLittleEndian2Bytes(istream *input)

{
  ulong uVar1;
  ostream *this;
  undefined1 local_1a;
  undefined1 local_19;
  istream *piStack_18;
  uchar buffer [2];
  istream *input_local;
  
  piStack_18 = input;
  memset(&local_1a,0,2);
  std::istream::read((char *)piStack_18,(long)&local_1a);
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) == 0) {
    input_local._6_2_ = CONCAT11(local_1a,local_19);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    input_local._6_2_ = 0;
  }
  return input_local._6_2_;
}

Assistant:

ushort MidiFile::readLittleEndian2Bytes(std::istream& input) {
	uchar buffer[2] = {0};
	input.read((char*)buffer, 2);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[1] | (buffer[0] << 8);
}